

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O0

void __thiscall
ncnn::CopyTo::resolve_copyto_offset
          (CopyTo *this,Mat *self_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset)

{
  int iVar1;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  bool numpy_style_slice;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  bool local_a1;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88 [4];
  long local_78;
  long local_70;
  byte local_65;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  int *local_48;
  int *local_40;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes [4];
  int *axes_ptr;
  int *starts_ptr;
  
  local_54 = *(int *)(in_RSI + 0x2c);
  local_58 = *(int *)(in_RSI + 0x30);
  local_5c = *(int *)(in_RSI + 0x34);
  local_60 = *(int *)(in_RSI + 0x38);
  local_8c = *(int *)(in_RSI + 0x28);
  local_64 = local_8c;
  _axes._0_8_ = (long *)(in_RDI + 0xe0);
  local_a1 = true;
  if (*(long *)(in_RDI + 0xe0) != 0) {
    local_a1 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
  }
  local_65 = (local_a1 ^ 0xffU) & 1;
  if ((bool)(local_a1 ^ 1)) {
    *in_RDX = 0;
    *in_RCX = 0;
    *in_R8 = 0;
    *in_R9 = 0;
    local_70 = *(long *)(in_RDI + 0xe0);
    _axes._8_8_ = (long *)(in_RDI + 0x128);
    local_78 = *(long *)(in_RDI + 0x128);
    local_88[0] = 0;
    local_88[1] = 1;
    local_88[2] = 2;
    local_88[3] = 3;
    iVar1 = *(int *)(in_RDI + 0x154);
    local_50 = in_R9;
    local_48 = in_R8;
    local_40 = in_RCX;
    _start = in_RDX;
    if (iVar1 != 0) {
      for (local_90 = 0; local_8c = iVar1, local_90 < iVar1; local_90 = local_90 + 1) {
        local_94 = *(int *)(local_78 + (long)local_90 * 4);
        if (local_94 < 0) {
          local_94 = local_64 + local_94;
        }
        local_88[local_90] = local_94;
      }
    }
    for (local_98 = 0; local_98 < local_8c; local_98 = local_98 + 1) {
      iVar1 = local_88[local_98];
      local_a0 = *(int *)(local_70 + (long)local_98 * 4);
      if (local_64 == 1) {
        if (local_a0 == -0xe9) {
          local_a0 = 0;
        }
        if (local_a0 < 0) {
          local_bc = local_54 + local_a0;
        }
        else {
          local_bc = local_a0;
        }
        *_start = local_bc;
      }
      if (local_64 == 2) {
        if (iVar1 == 0) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_c0 = local_58 + local_a0;
          }
          else {
            local_c0 = local_a0;
          }
          *local_40 = local_c0;
        }
        if (iVar1 == 1) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_c4 = local_54 + local_a0;
          }
          else {
            local_c4 = local_a0;
          }
          *_start = local_c4;
        }
      }
      if (local_64 == 3) {
        if (iVar1 == 0) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_c8 = local_60 + local_a0;
          }
          else {
            local_c8 = local_a0;
          }
          *local_50 = local_c8;
        }
        if (iVar1 == 1) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_cc = local_58 + local_a0;
          }
          else {
            local_cc = local_a0;
          }
          *local_40 = local_cc;
        }
        if (iVar1 == 2) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_d0 = local_54 + local_a0;
          }
          else {
            local_d0 = local_a0;
          }
          *_start = local_d0;
        }
      }
      if (local_64 == 4) {
        if (iVar1 == 0) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_d4 = local_60 + local_a0;
          }
          else {
            local_d4 = local_a0;
          }
          *local_50 = local_d4;
        }
        if (iVar1 == 1) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_d8 = local_5c + local_a0;
          }
          else {
            local_d8 = local_a0;
          }
          *local_48 = local_d8;
        }
        if (iVar1 == 2) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_dc = local_58 + local_a0;
          }
          else {
            local_dc = local_a0;
          }
          *local_40 = local_dc;
        }
        if (iVar1 == 3) {
          if (local_a0 == -0xe9) {
            local_a0 = 0;
          }
          if (local_a0 < 0) {
            local_e0 = local_54 + local_a0;
          }
          else {
            local_e0 = local_a0;
          }
          *_start = local_e0;
        }
      }
    }
  }
  else {
    *in_RDX = *(int *)(in_RDI + 0xd0);
    *in_RCX = *(int *)(in_RDI + 0xd4);
    *in_R8 = *(int *)(in_RDI + 0xd8);
    *in_R9 = *(int *)(in_RDI + 0xdc);
  }
  return;
}

Assistant:

void CopyTo::resolve_copyto_offset(const Mat& self_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset) const
{
    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;

    bool numpy_style_slice = !starts.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;

        const int* starts_ptr = starts;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                _woffset = start >= 0 ? start : w + start;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _coffset = start >= 0 ? start : channels + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    _coffset = start >= 0 ? start : channels + start;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    _doffset = start >= 0 ? start : d + start;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    _hoffset = start >= 0 ? start : h + start;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    _woffset = start >= 0 ? start : w + start;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
    }
}